

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void prvTidyCoerceNode(TidyDocImpl *doc,Node *node,TidyTagId tid,Bool obsolete,Bool unexpected)

{
  Dict *pDVar1;
  Node *node_00;
  tmbstr ptVar2;
  Node *tmp;
  Dict *tag;
  Bool unexpected_local;
  Bool obsolete_local;
  TidyTagId tid_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  pDVar1 = prvTidyLookupTagDef(tid);
  node_00 = prvTidyInferredTag(doc,pDVar1->id);
  if (obsolete == no) {
    if (unexpected == no) {
      prvTidyReport(doc,node,node_00,0x273);
    }
    else {
      prvTidyReport(doc,node,node_00,0x274);
    }
  }
  else {
    prvTidyReport(doc,node,node_00,0x269);
  }
  (*doc->allocator->vtbl->free)(doc->allocator,node_00->element);
  (*doc->allocator->vtbl->free)(doc->allocator,node_00);
  node->was = node->tag;
  node->tag = pDVar1;
  node->type = StartTag;
  node->implicit = yes;
  (*doc->allocator->vtbl->free)(doc->allocator,node->element);
  ptVar2 = prvTidytmbstrdup(doc->allocator,pDVar1->name);
  node->element = ptVar2;
  return;
}

Assistant:

void TY_(CoerceNode)(TidyDocImpl* doc, Node *node, TidyTagId tid, Bool obsolete, Bool unexpected)
{
    const Dict* tag = TY_(LookupTagDef)(tid);
    Node* tmp = TY_(InferredTag)(doc, tag->id);

    if (obsolete)
        TY_(Report)(doc, node, tmp, OBSOLETE_ELEMENT);
    else if (unexpected)
        TY_(Report)(doc, node, tmp, REPLACING_UNEX_ELEMENT);
    else
        TY_(Report)(doc, node, tmp, REPLACING_ELEMENT);

    TidyDocFree(doc, tmp->element);
    TidyDocFree(doc, tmp);

    node->was = node->tag;
    node->tag = tag;
    node->type = StartTag;
    node->implicit = yes;
    TidyDocFree(doc, node->element);
    node->element = TY_(tmbstrdup)(doc->allocator, tag->name);
}